

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

Recycler * __thiscall Memory::Recycler::TrackAllocInfo(Recycler *this,TrackAllocData *data)

{
  undefined4 *puVar1;
  code *pcVar2;
  type_info *ptVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 uVar6;
  bool bVar7;
  undefined8 *in_FS_OFFSET;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    bVar7 = TrackAllocData::IsEmpty(&this->nextAllocData);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1fb1,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
      if (!bVar7) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    uVar6 = *(undefined4 *)&data->field_0x24;
    (this->nextAllocData).line = data->line;
    *(undefined4 *)&(this->nextAllocData).field_0x24 = uVar6;
    ptVar3 = data->typeinfo;
    sVar4 = data->plusSize;
    pcVar5 = data->filename;
    (this->nextAllocData).count = data->count;
    (this->nextAllocData).filename = pcVar5;
    (this->nextAllocData).typeinfo = ptVar3;
    (this->nextAllocData).plusSize = sVar4;
  }
  return this;
}

Assistant:

Recycler *
Recycler::TrackAllocInfo(TrackAllocData const& data)
{
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty());
        nextAllocData = data;
    }
#endif
    return this;
}